

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

Acb_Ntk_t * Acb_NtkFromAbc(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void **ppvVar4;
  long *plVar5;
  long lVar6;
  Abc_Nam_t *p_00;
  int iVar7;
  uint uVar8;
  Acb_Man_t *p_01;
  Acb_Ntk_t *p_02;
  word *pwVar9;
  word wVar10;
  Vec_Ptr_t *pVVar11;
  char *pcVar12;
  Abc_Nam_t *in_RCX;
  ulong uVar13;
  Abc_Nam_t *in_RDX;
  Acb_ObjType_t Type;
  ulong uVar14;
  Abc_Nam_t *in_R8;
  Hash_IntMan_t *in_R9;
  long lVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  int local_2c;
  
  p_01 = Acb_ManAlloc(p->pSpec,0,in_RDX,in_RCX,in_R8,in_R9);
  iVar7 = Abc_NamStrFindOrAdd(p_01->pStrs,p->pName,(int *)0x0);
  uVar8 = p->vCos->nSize;
  uVar13 = (ulong)uVar8;
  p_02 = Acb_NtkAlloc(p_01,iVar7,p->vCis->nSize,uVar8,p->vObjs->nSize + -1);
  if ((p->ntkFunc != ABC_FUNC_SOP) || (p->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                  ,0x4f,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
  }
  p_02->nFaninMax = 6;
  pVVar11 = p->vObjs;
  uVar14 = (ulong)(uint)pVVar11->nSize;
  if (1 < pVVar11->nSize) {
    lVar17 = 1;
    do {
      pvVar3 = pVVar11->pArray[lVar17];
      if (pvVar3 == (void *)0x0) {
        Acb_ObjAlloc(p_02,ABC_OPER_NONE,0,(int)uVar13);
      }
      else {
        uVar8 = *(uint *)((long)pvVar3 + 0x14) & 0xf;
        if ((uVar8 == 5) || (uVar8 == 2)) {
          Type = ABC_OPER_CI;
          iVar7 = 0;
        }
        else {
          uVar13 = (ulong)(uVar8 - 5);
          if (uVar8 - 5 < 0xfffffffe) {
            if (uVar8 != 7) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                            ,0x5c,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
            }
            iVar7 = *(int *)((long)pvVar3 + 0x1c);
            Type = ABC_OPER_LUT;
          }
          else {
            Type = ABC_OPER_CO;
            iVar7 = 1;
          }
        }
        iVar7 = Acb_ObjAlloc(p_02,Type,iVar7,(int)uVar13);
        *(int *)((long)pvVar3 + 0x40) = iVar7;
        if (iVar7 != *(int *)((long)pvVar3 + 0x10)) {
          __assert_fail("pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                        ,0x5d,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
        }
      }
      lVar17 = lVar17 + 1;
      pVVar11 = p->vObjs;
      uVar14 = (ulong)pVVar11->nSize;
    } while (lVar17 < (long)uVar14);
  }
  if (0 < (int)uVar14) {
    ppvVar4 = pVVar11->pArray;
    lVar17 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar17];
      if (((plVar5 != (long *)0x0) && ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7)) &&
         (0 < *(int *)((long)plVar5 + 0x1c))) {
        lVar18 = plVar5[4];
        lVar6 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
        lVar15 = 0;
        do {
          iVar7 = (int)plVar5[8];
          if ((long)iVar7 < 1) goto LAB_0038ea1b;
          if ((p_02->vObjFans).nSize <= iVar7) goto LAB_0038e9fc;
          iVar7 = (p_02->vObjFans).pArray[iVar7];
          if (((long)iVar7 < 0) || ((p_02->vFanSto).nSize <= iVar7)) goto LAB_0038e99f;
          iVar1 = *(int *)(*(long *)(lVar6 + (long)*(int *)(lVar18 + lVar15 * 4) * 8) + 0x40);
          if (iVar1 < 1) goto LAB_0038e9dd;
          piVar16 = (p_02->vFanSto).pArray + iVar7;
          iVar7 = *piVar16;
          if (piVar16[(long)iVar7 + 1] != -1) goto LAB_0038e9be;
          *piVar16 = iVar7 + 1;
          piVar16[(long)iVar7 + 1] = iVar1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)plVar5 + 0x1c));
        uVar14 = (ulong)(uint)pVVar11->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)uVar14);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    ppvVar4 = pVVar11->pArray;
    lVar17 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar17];
      iVar7 = (int)plVar5[8];
      if ((long)iVar7 < 1) {
LAB_0038ea1b:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p_02->vObjFans).nSize <= iVar7) {
LAB_0038e9fc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = (p_02->vObjFans).pArray[iVar7];
      if (((long)iVar7 < 0) || ((p_02->vFanSto).nSize <= iVar7)) {
LAB_0038e99f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                (long)*(int *)plVar5[4] * 8) + 0x40);
      if (iVar1 < 1) {
LAB_0038e9dd:
        __assert_fail("iFanin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      piVar16 = (p_02->vFanSto).pArray + iVar7;
      iVar7 = *piVar16;
      if (piVar16[(long)iVar7 + 1] != -1) {
LAB_0038e9be:
        __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      *piVar16 = iVar7 + 1;
      piVar16[(long)iVar7 + 1] = iVar1;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar11->nSize);
  }
  uVar8 = (p_02->vObjType).nCap;
  if ((p_02->vObjTruth).nCap < (int)uVar8) {
    pwVar9 = (p_02->vObjTruth).pArray;
    if (pwVar9 == (word *)0x0) {
      pwVar9 = (word *)malloc((long)(int)uVar8 << 3);
    }
    else {
      pwVar9 = (word *)realloc(pwVar9,(long)(int)uVar8 << 3);
    }
    (p_02->vObjTruth).pArray = pwVar9;
    if (pwVar9 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p_02->vObjTruth).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((p_02->vObjTruth).pArray,0,(ulong)uVar8 * 8);
  }
  (p_02->vObjTruth).nSize = uVar8;
  pVVar11 = p->vObjs;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar17];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        uVar8 = *(uint *)((long)pvVar3 + 0x40);
        lVar18 = (long)(int)uVar8;
        wVar10 = Abc_SopToTruth(*(char **)((long)pvVar3 + 0x38),*(int *)((long)pvVar3 + 0x1c));
        if (lVar18 < 1) {
          pcVar12 = "i>0";
LAB_0038ea88:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
        }
        uVar2 = (p_02->vObjTruth).nSize;
        if ((int)uVar2 < 1) {
          pcVar12 = "Acb_NtkHasObjTruths(p)";
          goto LAB_0038ea88;
        }
        if (uVar2 <= uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        pwVar9 = (p_02->vObjTruth).pArray;
        if (pwVar9[lVar18] != 0) {
          __assert_fail("Acb_ObjTruth(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
        }
        pwVar9[lVar18] = wVar10;
        pVVar11 = p->vObjs;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar11->nSize);
  }
  p_02->nRegs = p->nObjCounts[8];
  p_00 = p_01->pMods;
  pcVar12 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
  iVar7 = Abc_NamStrFindOrAdd(p_00,pcVar12,&local_2c);
  if (local_2c == 0) {
    if (iVar7 != p_02->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar12 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
    printf("Network with name \"%s\" already exists.\n",pcVar12);
  }
  return p_02;
}

Assistant:

Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNumMax(p)-1 );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    for ( i = 1; i < Abc_NtkObjNumMax(p); i++ )
    {
        pObj = Abc_NtkObj( p, i );
        if ( pObj == NULL )
            Acb_ObjAlloc( pNtk, ABC_OPER_NONE, 0, 0 );
        else if ( Abc_ObjIsCi(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        else if ( Abc_ObjIsCo(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        else if ( Abc_ObjIsNode(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
        else assert( 0 );
        assert( pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj) );
    }
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}